

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O0

void sFillRHS(trans_t trans,int nrhs,float *x,int ldx,SuperMatrix *A,SuperMatrix *B)

{
  char local_55;
  int local_54;
  undefined4 uStack_50;
  char transc [1];
  int ldc;
  float zero;
  float one;
  float *rhs;
  DNformat *Bstore;
  SuperMatrix *B_local;
  SuperMatrix *A_local;
  int ldx_local;
  float *x_local;
  int nrhs_local;
  trans_t trans_local;
  
  uStack_50 = 0;
  local_54 = *B->Store;
  if (trans == NOTRANS) {
    local_55 = 'N';
  }
  else {
    local_55 = 'T';
  }
  sp_sgemm(&local_55,"N",A->nrow,nrhs,A->ncol,1.0,A,x,ldx,0.0,*(float **)((long)B->Store + 8),
           local_54);
  return;
}

Assistant:

void
sFillRHS(trans_t trans, int nrhs, float *x, int ldx,
         SuperMatrix *A, SuperMatrix *B)
{
    DNformat *Bstore;
    float   *rhs;
    float one = 1.0;
    float zero = 0.0;
    int      ldc;
    char transc[1];

    //Astore = A->Store;
    //Aval   = (float *) Astore->nzval;
    Bstore = B->Store;
    rhs    = Bstore->nzval;
    ldc    = Bstore->lda;
    
    if ( trans == NOTRANS ) *(unsigned char *)transc = 'N';
    else *(unsigned char *)transc = 'T';

    sp_sgemm(transc, "N", A->nrow, nrhs, A->ncol, one, A,
	     x, ldx, zero, rhs, ldc);

}